

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * vera::mergeChannels(Image *__return_storage_ptr__,Image *_red,Image *_green,Image *_blue)

{
  int iVar1;
  int iVar2;
  uint _width;
  uint _height;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  Image *out;
  undefined1 local_54 [12];
  ulong local_48;
  ulong local_40;
  Image *local_38;
  
  iVar1 = (*_red->_vptr_Image[8])(_red);
  if (((iVar1 < 2) && (iVar1 = (*_green->_vptr_Image[8])(_green), iVar1 < 2)) &&
     (iVar1 = (*_blue->_vptr_Image[8])(), iVar1 < 2)) {
    iVar1 = (*_red->_vptr_Image[6])(_red);
    iVar2 = (*_green->_vptr_Image[6])(_green);
    if (iVar1 == iVar2) {
      iVar1 = (*_red->_vptr_Image[6])(_red);
      iVar2 = (*_blue->_vptr_Image[6])();
      if (iVar1 == iVar2) {
        iVar1 = (*_red->_vptr_Image[7])(_red);
        iVar2 = (*_green->_vptr_Image[7])(_green);
        if (iVar1 == iVar2) {
          iVar1 = (*_red->_vptr_Image[7])(_red);
          iVar2 = (*_blue->_vptr_Image[7])();
          if (iVar1 == iVar2) {
            local_38 = _green;
            _width = (*_red->_vptr_Image[6])(_red);
            _height = (*_red->_vptr_Image[7])(_red);
            Image::Image(__return_storage_ptr__,_width,_height,3);
            if ((int)_height < 1) {
              return __return_storage_ptr__;
            }
            local_40 = (ulong)_width;
            uVar5 = 0;
            local_48 = (ulong)_height;
            do {
              if (0 < (int)_width) {
                uVar4 = 0;
                do {
                  iVar3 = (*_red->_vptr_Image[0xe])(_red,uVar4,uVar5);
                  iVar1 = __return_storage_ptr__->m_width;
                  iVar2 = __return_storage_ptr__->m_channels;
                  lVar6 = (long)iVar3;
                  (*_red->_vptr_Image[0x18])(_red,lVar6);
                  (*local_38->_vptr_Image[0x18])(local_38,lVar6);
                  (*_blue->_vptr_Image[0x18])(_blue,lVar6);
                  (*__return_storage_ptr__->_vptr_Image[0x12])
                            (__return_storage_ptr__,((long)iVar1 * uVar5 + uVar4) * (long)iVar2,
                             local_54,3);
                  uVar4 = uVar4 + 1;
                } while (local_40 != uVar4);
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 != local_48);
            return __return_storage_ptr__;
          }
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR: mergeChannel() all images must be the same size",0x36);
    _red = _green;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR: mergeChannel() arguments must be all grayscale images",
               0x3c);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  Image::Image(__return_storage_ptr__,_red);
  return __return_storage_ptr__;
}

Assistant:

Image mergeChannels(const Image& _red, const Image& _green, const Image& _blue) {
    if (_red.getChannels() > 1 ||
        _green.getChannels() > 1 ||
        _blue.getChannels() > 1 ) {
        std::cout << "ERROR: mergeChannel() arguments must be all grayscale images" << std::endl;
        return _red;
    }

    if (_red.getWidth() != _green.getWidth() || _red.getWidth() != _blue.getWidth() ||
        _red.getHeight() != _green.getHeight() || _red.getHeight() != _blue.getHeight()) {
        std::cout << "ERROR: mergeChannel() all images must be the same size" << std::endl;
        return _green;
    }
    int width = _red.getWidth();
    int height = _red.getHeight();
    Image out = Image(width, height, 3);
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++) {
            int index = _red.getIndex(x, y);
            out.setColor(   out.getIndex(x,y), 
                            glm::vec3(_red.getValue(index), _green.getValue(index), _blue.getValue(index)));
        }
    }
    return out;
}